

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  JSValue obj;
  JSValue v_00;
  int iVar5;
  undefined8 *puVar6;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  uint64_t v_3;
  uint64_t *p2_3;
  uint64_t *p1_3;
  uint32_t v_2;
  uint32_t *p2_2;
  uint32_t *p1_2;
  uint16_t v_1;
  uint16_t *p2_1;
  uint16_t *p1_1;
  uint8_t v;
  uint8_t *p2;
  uint8_t *p1;
  int len;
  JSObject *p;
  JSContext *in_stack_ffffffffffffff58;
  JSValueUnion in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  undefined8 *puVar7;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined2 *local_70;
  undefined2 *local_68;
  undefined1 *local_58;
  undefined1 *local_50;
  JSValueUnion local_10;
  int64_t local_8;
  
  obj.tag = in_stack_ffffffffffffff68;
  obj.u.float64 = in_stack_ffffffffffffff60.float64;
  iVar5 = js_typed_array_get_length_internal(in_stack_ffffffffffffff58,obj);
  if (iVar5 < 0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    if (0 < iVar5) {
      switch("includes"[(ulong)*(ushort *)((long)in_RSI.ptr + 6) + 1]) {
      case '\0':
        local_58 = *(undefined1 **)((long)in_RSI.ptr + 0x38) + iVar5;
        local_50 = *(undefined1 **)((long)in_RSI.ptr + 0x38);
        while (local_58 = local_58 + -1, local_50 < local_58) {
          uVar1 = *local_50;
          *local_50 = *local_58;
          *local_58 = uVar1;
          local_50 = local_50 + 1;
        }
        break;
      case '\x01':
        local_70 = *(undefined2 **)((long)in_RSI.ptr + 0x38) + iVar5;
        local_68 = *(undefined2 **)((long)in_RSI.ptr + 0x38);
        while (local_70 = local_70 + -1, local_68 < local_70) {
          uVar2 = *local_68;
          *local_68 = *local_70;
          *local_70 = uVar2;
          local_68 = local_68 + 1;
        }
        break;
      case '\x02':
        local_88 = *(undefined4 **)((long)in_RSI.ptr + 0x38) + iVar5;
        local_80 = *(undefined4 **)((long)in_RSI.ptr + 0x38);
        while (local_88 = local_88 + -1, local_80 < local_88) {
          uVar3 = *local_80;
          *local_80 = *local_88;
          *local_88 = uVar3;
          local_80 = local_80 + 1;
        }
        break;
      case '\x03':
        puVar7 = *(undefined8 **)((long)in_RSI.ptr + 0x38);
        puVar6 = puVar7 + iVar5;
        for (; puVar6 = puVar6 + -1, puVar7 < puVar6; puVar7 = puVar7 + 1) {
          uVar4 = *puVar7;
          *puVar7 = *puVar6;
          *puVar6 = uVar4;
        }
        break;
      default:
        abort();
      }
    }
    v_00.tag = in_RDX;
    v_00.u.ptr = in_RSI.ptr;
    _local_10 = JS_DupValue(in_RDI,v_00);
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_reverse(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    JSObject *p;
    int len;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    if (len > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        switch (typed_array_size_log2(p->class_id)) {
        case 0:
            {
                uint8_t *p1 = p->u.array.u.uint8_ptr;
                uint8_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint8_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 1:
            {
                uint16_t *p1 = p->u.array.u.uint16_ptr;
                uint16_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint16_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 2:
            {
                uint32_t *p1 = p->u.array.u.uint32_ptr;
                uint32_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint32_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 3:
            {
                uint64_t *p1 = p->u.array.u.uint64_ptr;
                uint64_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint64_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        default:
            abort();
        }
    }
    return JS_DupValue(ctx, this_val);
}